

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerStElemC(Lowerer *this,Instr *stElem)

{
  LowererMD *pLVar1;
  IRType IVar2;
  Instr *pIVar3;
  Instr *insertBeforeInstr;
  code *pcVar4;
  bool bVar5;
  IRType IVar6;
  byte bVar7;
  ObjectType OVar8;
  int32 iVar9;
  IndirOpnd *this_00;
  RegOpnd *pRVar10;
  undefined4 *puVar11;
  RegOpnd *pRVar12;
  JitProfilingInstr *pJVar13;
  Opnd *pOVar14;
  HelperCallOpnd *newSrc;
  IntConstOpnd *pIVar15;
  Instr *instr;
  LabelInstr *target;
  Lowerer *this_01;
  int iVar16;
  long value;
  long lStackY_80;
  LabelInstr *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType baseValueType;
  
  pIVar3 = stElem->m_prev;
  this_00 = IR::Opnd::AsIndirOpnd(stElem->m_dst);
  pRVar10 = IR::IndirOpnd::UnlinkIndexOpnd(this_00);
  if (pRVar10 == (RegOpnd *)0x0) {
    iVar9 = this_00->m_offset;
  }
  else {
    bVar5 = StackSym::IsIntConst(pRVar10->m_sym);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2bc6,"(!indexOpnd || indexOpnd->m_sym->IsIntConst())",
                         "!indexOpnd || indexOpnd->m_sym->IsIntConst()");
      if (!bVar5) goto LAB_0055c7d7;
      *puVar11 = 0;
    }
    pRVar12 = IR::Opnd::AsRegOpnd(&pRVar10->super_Opnd);
    iVar9 = StackSym::GetIntConstValue(pRVar12->m_sym);
    IR::Opnd::Free(&pRVar10->super_Opnd,this->m_func);
  }
  value = (long)iVar9;
  if (stElem->m_kind == InstrKindJitProfiling) {
    pJVar13 = IR::Instr::AsJitProfilingInstr(stElem);
    if (pJVar13->profileId != 0xffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2bd5,
                         "(stElem->AsJitProfilingInstr()->profileId == Js::Constants::NoProfileId)",
                         "stElem->AsJitProfilingInstr()->profileId == Js::Constants::NoProfileId");
      if (!bVar5) goto LAB_0055c7d7;
      *puVar11 = 0;
    }
    pLVar1 = &this->m_lowererMD;
    pOVar14 = IR::Instr::UnlinkSrc1(stElem);
    LowererMD::LoadHelperArgument(pLVar1,stElem,pOVar14);
    newSrc = IR::HelperCallOpnd::New
                       ((stElem->m_opcode != StElemC) + HelperSimpleStoreArrayHelper,this->m_func);
    IR::Instr::SetSrc1(stElem,&newSrc->super_Opnd);
    pIVar15 = IR::IntConstOpnd::New(value,TyUint32,this->m_func,false);
    LowererMD::LoadHelperArgument(pLVar1,stElem,&pIVar15->super_Opnd);
    pRVar10 = IR::IndirOpnd::UnlinkBaseOpnd(this_00);
    LowererMD::LoadHelperArgument(pLVar1,stElem,&pRVar10->super_Opnd);
    pOVar14 = IR::Instr::UnlinkDst(stElem);
    IR::Opnd::Free(pOVar14,this->m_func);
    LowererMD::LowerCall(pLVar1,stElem,0);
    return pIVar3;
  }
  pRVar10 = this_00->m_baseOpnd;
  local_32[0] = (pRVar10->super_Opnd).m_valueType.field_0;
  bVar5 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
  if (bVar5) {
    if (stElem->m_opcode != StElemC) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2bea,"(stElem->m_opcode == Js::OpCode::StElemC)",
                         "stElem->m_opcode == Js::OpCode::StElemC");
      if (!bVar5) goto LAB_0055c7d7;
      *puVar11 = 0;
    }
    if ((stElem->field_0x38 & 0x10) == 0) {
      local_40 = (LabelInstr *)0x0;
      instr = stElem;
    }
    else {
      local_40 = IR::LabelInstr::New(Label,this->m_func,true);
      instr = IR::Instr::New(stElem->m_opcode,this->m_func);
      IR::Instr::TransferTo(stElem,instr);
      IR::Instr::InsertBefore(stElem,instr);
      target = IR::LabelInstr::New(Label,this->m_func,false);
      InsertBranch(Br,target,stElem);
      IR::Instr::InsertBefore(stElem,&local_40->super_Instr);
      IR::Instr::InsertAfter(stElem,&target->super_Instr);
      stElem->m_opcode = BailOut;
      GenerateBailOut(this,stElem,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    }
    bVar5 = ValueType::IsObject((ValueType *)&local_32[0].field_0);
    if (!bVar5) {
      if (local_40 == (LabelInstr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2c04,"(labelBailOut)","labelBailOut");
        if (!bVar5) goto LAB_0055c7d7;
        *puVar11 = 0;
      }
      GenerateArrayTest(this,pRVar10,local_40,local_40,instr,true,false,false);
    }
    if (instr->m_src1->m_type == TyVar) {
      if (local_40 == (LabelInstr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2c0f,"(labelBailOut)","labelBailOut");
        if (!bVar5) goto LAB_0055c7d7;
        *puVar11 = 0;
      }
      LoadScriptContext(this,instr);
      pLVar1 = &this->m_lowererMD;
      pOVar14 = IR::Instr::UnlinkSrc1(instr);
      LowererMD::LoadHelperArgument(pLVar1,instr,pOVar14);
      pIVar15 = IR::IntConstOpnd::New(value,TyUint32,this->m_func,false);
      LowererMD::LoadHelperArgument(pLVar1,instr,&pIVar15->super_Opnd);
      pRVar10 = IR::IndirOpnd::UnlinkBaseOpnd(this_00);
      LowererMD::LoadHelperArgument(pLVar1,instr,&pRVar10->super_Opnd);
      bVar5 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
      insertBeforeInstr = instr->m_next;
      pRVar10 = IR::RegOpnd::New(TyUint32,this->m_func);
      IR::Instr::ReplaceDst(instr,&pRVar10->super_Opnd);
      LowererMD::ChangeToHelperCall
                (pLVar1,instr,bVar5 ^ HelperScrArr_SetNativeFloatElementC,(LabelInstr *)0x0,
                 (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
      bVar5 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
      this_01 = (Lowerer *)((ulong)!bVar5 * 2 + 0x1e);
      pIVar15 = IR::IntConstOpnd::New((IntConstType)this_01,TyUint32,this->m_func,false);
      InsertCompareBranch(this_01,&pRVar10->super_Opnd,&pIVar15->super_Opnd,BrNeq_A,local_40,
                          insertBeforeInstr,false);
      return pIVar3;
    }
    bVar5 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
    IVar2 = instr->m_src1->m_type;
    IVar6 = GetArrayIndirType((ValueType)local_32[0].field_0);
    if (local_40 == (LabelInstr *)0x0 || !bVar5) {
      if (IVar2 != IVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2c4c,
                           "(stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType))",
                           "stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType)");
        if (!bVar5) goto LAB_0055c7d7;
        *puVar11 = 0;
      }
    }
    else {
      if (IVar2 != IVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2c38,
                           "(stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType))",
                           "stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType)");
        if (!bVar5) goto LAB_0055c7d7;
        *puVar11 = 0;
      }
      pOVar14 = GetMissingItemOpnd(instr->m_src1->m_type,this->m_func);
      bVar5 = IR::Opnd::IsEqual(instr->m_src1,pOVar14);
      if (bVar5) {
        InsertBranch(Br,local_40,instr);
        local_40->field_0x78 = local_40->field_0x78 | 0x20;
        IR::Instr::Remove(instr);
        return pIVar3;
      }
      InsertMissingItemCompareBranch(this,instr->m_src1,BrEq_A,local_40,instr);
    }
    instr->m_dst->m_type = instr->m_src1->m_type;
    if (0x40 < iVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2c4f,"(value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE)",
                         "value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE");
      if (!bVar5) goto LAB_0055c7d7;
      *puVar11 = 0;
    }
    ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
    lStackY_80 = 0x58;
    stElem = instr;
LAB_0055c6d6:
    if (iVar9 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2c66,"(value >= 0)","value >= 0");
      if (!bVar5) goto LAB_0055c7d7;
      goto LAB_0055c72a;
    }
  }
  else {
    bVar5 = ValueType::IsLikelyObject((ValueType *)&local_32[0].field_0);
    if ((!bVar5) ||
       (OVar8 = ValueType::GetObjectType((ValueType *)&local_32[0].field_0), OVar8 != Array)) {
      if ((stElem->m_opcode & ~ExtendedOpcodePrefix) != StElemC) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2c62,
                           "(stElem->m_opcode == Js::OpCode::StElemC || stElem->m_opcode == Js::OpCode::StArrSegElemC)"
                           ,
                           "stElem->m_opcode == Js::OpCode::StElemC || stElem->m_opcode == Js::OpCode::StArrSegElemC"
                          );
        if (!bVar5) goto LAB_0055c7d7;
        *puVar11 = 0;
      }
      lStackY_80 = 0x18;
      if ((this_00->m_baseOpnd->super_Opnd).m_type != TyVar) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2c63,"(indirOpnd->GetBaseOpnd()->GetType() == TyVar)",
                           "indirOpnd->GetBaseOpnd()->GetType() == TyVar");
        if (!bVar5) goto LAB_0055c7d7;
        *puVar11 = 0;
      }
      goto LAB_0055c6d6;
    }
    if (stElem->m_opcode != StElemC) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2c5c,"(stElem->m_opcode == Js::OpCode::StElemC)",
                         "stElem->m_opcode == Js::OpCode::StElemC");
      if (!bVar5) goto LAB_0055c7d7;
      *puVar11 = 0;
    }
    if (iVar9 < 0x41) {
      lStackY_80 = 0x50;
      goto LAB_0055c6d6;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2c5d,"(value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE)",
                       "value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE");
    if (!bVar5) goto LAB_0055c7d7;
    lStackY_80 = 0x50;
LAB_0055c72a:
    *puVar11 = 0;
  }
  bVar5 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)&local_32[0].field_0);
  if (bVar5) {
    bVar7 = GetArrayIndirScale((ValueType)local_32[0].field_0);
  }
  else {
    bVar7 = LowererMDArch::GetDefaultIndirScale();
  }
  lStackY_80 = (value << (bVar7 & 0x3f)) + lStackY_80;
  iVar16 = (int)lStackY_80;
  if (iVar16 != lStackY_80) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2c6c,"(Math::FitsInDWord(offset))","Math::FitsInDWord(offset)");
    if (!bVar5) {
LAB_0055c7d7:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar11 = 0;
  }
  this_00->m_offset = iVar16;
  (this_00->super_Opnd).field_0xe = 0;
  LowererMD::ChangeToWriteBarrierAssign(stElem,this->m_func);
  return pIVar3;
}

Assistant:

IR::Instr *
Lowerer::LowerStElemC(IR::Instr * stElem)
{
    IR::Instr *instrPrev = stElem->m_prev;
    IR::IndirOpnd * indirOpnd = stElem->GetDst()->AsIndirOpnd();
    IR::RegOpnd *indexOpnd = indirOpnd->UnlinkIndexOpnd();

    Assert(!indexOpnd || indexOpnd->m_sym->IsIntConst());

    IntConstType value;
    if (indexOpnd)
    {
        value = indexOpnd->AsRegOpnd()->m_sym->GetIntConstValue();
        indexOpnd->Free(this->m_func);
    }
    else
    {
        value = (IntConstType)indirOpnd->GetOffset();
    }

    if (stElem->IsJitProfilingInstr())
    {
        Assert(stElem->AsJitProfilingInstr()->profileId == Js::Constants::NoProfileId);
        m_lowererMD.LoadHelperArgument(stElem, stElem->UnlinkSrc1());

        const auto meth = stElem->m_opcode == Js::OpCode::StElemC ? IR::HelperSimpleStoreArrayHelper : IR::HelperSimpleStoreArraySegHelper;

        stElem->SetSrc1(IR::HelperCallOpnd::New(meth, m_func));

        m_lowererMD.LoadHelperArgument(stElem, IR::IntConstOpnd::New(value, TyUint32, m_func));
        m_lowererMD.LoadHelperArgument(stElem, indirOpnd->UnlinkBaseOpnd());

        stElem->UnlinkDst()->Free(m_func);

        m_lowererMD.LowerCall(stElem, 0);
        return instrPrev;
    }

    IntConstType base;
    IR::RegOpnd *baseOpnd = indirOpnd->GetBaseOpnd();
    const ValueType baseValueType(baseOpnd->GetValueType());
    if(baseValueType.IsLikelyNativeArray())
    {
        Assert(stElem->m_opcode == Js::OpCode::StElemC);

        IR::LabelInstr *labelBailOut = nullptr;
        IR::Instr *instrBailOut = nullptr;

        if (stElem->HasBailOutInfo())
        {
            labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
            instrBailOut = stElem;
            stElem = IR::Instr::New(instrBailOut->m_opcode, m_func);
            instrBailOut->TransferTo(stElem);
            instrBailOut->InsertBefore(stElem);

            IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, m_func);
            InsertBranch(Js::OpCode::Br, labelDone, instrBailOut);

            instrBailOut->InsertBefore(labelBailOut);
            instrBailOut->InsertAfter(labelDone);

            instrBailOut->m_opcode = Js::OpCode::BailOut;
            GenerateBailOut(instrBailOut);
        }

        if (!baseValueType.IsObject())
        {
            // Likely native array: do a vtable check and bail if it fails.
            Assert(labelBailOut);
            GenerateArrayTest(baseOpnd, labelBailOut, labelBailOut, stElem, true);
        }

        if (stElem->GetSrc1()->GetType() == TyVar)
        {
            // Storing a non-specialized value. This may cause array conversion, which invalidates all the code
            // that depends on the array check we've already done.
            // Call a helper that returns the type ID of the resulting array, check it here against the one we
            // expect, and bail if it fails.

            Assert(labelBailOut);

            // Call a helper to (try and) unbox the var and store it.
            // If we had to convert the array to do the store, we'll bail.
            LoadScriptContext(stElem);

            m_lowererMD.LoadHelperArgument(stElem, stElem->UnlinkSrc1());

            IR::IntConstOpnd * intConstIndexOpnd = IR::IntConstOpnd::New(value, TyUint32, m_func);

            m_lowererMD.LoadHelperArgument(stElem, intConstIndexOpnd);
            m_lowererMD.LoadHelperArgument(stElem, indirOpnd->UnlinkBaseOpnd());

            IR::JnHelperMethod helperMethod;
            if (baseValueType.HasIntElements())
            {
                helperMethod = IR::HelperScrArr_SetNativeIntElementC;
            }
            else
            {
                helperMethod = IR::HelperScrArr_SetNativeFloatElementC;
            }

            IR::Instr *instrInsertBranch = stElem->m_next;
            IR::RegOpnd *typeIdOpnd = IR::RegOpnd::New(TyUint32, m_func);
            stElem->ReplaceDst(typeIdOpnd);
            m_lowererMD.ChangeToHelperCall(stElem, helperMethod);

            InsertCompareBranch(
                typeIdOpnd,
                IR::IntConstOpnd::New(
                    baseValueType.HasIntElements() ?
                    Js::TypeIds_NativeIntArray : Js::TypeIds_NativeFloatArray, TyUint32, m_func),
                Js::OpCode::BrNeq_A,
                labelBailOut,
                instrInsertBranch);

            return instrPrev;
        }
        else if (baseValueType.HasIntElements() && labelBailOut)
        {
            Assert(stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType));
            IR::Opnd* missingElementOpnd = GetMissingItemOpnd(stElem->GetSrc1()->GetType(), m_func);
            if (!stElem->GetSrc1()->IsEqual(missingElementOpnd))
            {
                InsertMissingItemCompareBranch(stElem->GetSrc1(), Js::OpCode::BrEq_A, labelBailOut, stElem);
            }
            else
            {
                //Its a missing value store and data flow proves that src1 is always missing value. Array cannot be an int array at the first place
                //if this code was ever hit. Just bailout, this code path would be updated with the profile information next time around.
                InsertBranch(Js::OpCode::Br, labelBailOut, stElem);
#if DBG
                labelBailOut->m_noHelperAssert = true;
#endif
                stElem->Remove();
                return instrPrev;
            }
        }
        else
        {
            Assert(stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType));
        }
        stElem->GetDst()->SetType(stElem->GetSrc1()->GetType());
        Assert(value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE);

        if(baseValueType.HasIntElements())
        {
            base = sizeof(Js::JavascriptNativeIntArray) + offsetof(Js::SparseArraySegment<int32>, elements);
        }
        else
        {
            base = sizeof(Js::JavascriptNativeFloatArray) + offsetof(Js::SparseArraySegment<double>, elements);
        }
    }
    else if(baseValueType.IsLikelyObject() && baseValueType.GetObjectType() == ObjectType::Array)
    {
        Assert(stElem->m_opcode == Js::OpCode::StElemC);
        Assert(value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE);
        base = sizeof(Js::JavascriptArray) + offsetof(Js::SparseArraySegment<Js::Var>, elements);
    }
    else
    {
        Assert(stElem->m_opcode == Js::OpCode::StElemC || stElem->m_opcode == Js::OpCode::StArrSegElemC);
        Assert(indirOpnd->GetBaseOpnd()->GetType() == TyVar);
        base = offsetof(Js::SparseArraySegment<Js::Var>, elements);
    }
    Assert(value >= 0);

    //  MOV [r3 + offset(element) + index], src
    const BYTE indirScale =
        baseValueType.IsLikelyAnyOptimizedArray() ? GetArrayIndirScale(baseValueType) : m_lowererMD.GetDefaultIndirScale();
    IntConstType offset = base + (value << indirScale);
    Assert(Math::FitsInDWord(offset));
    indirOpnd->SetOffset((int32)offset);
    m_lowererMD.ChangeToWriteBarrierAssign(stElem, this->m_func);

    return instrPrev;
}